

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_conv_2d_dw_direct
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int stride0,int stride1,int pad0,int pad1
          ,int dilation0,int dilation1)

{
  size_t sVar1;
  ggml_tensor *pgVar2;
  char *pcVar3;
  size_t sVar4;
  int line;
  char *file;
  long local_58;
  long local_50;
  long local_48;
  int64_t local_40;
  
  if (a->ne[2] == 1) {
    if (a->ne[3] == b->ne[2]) {
      local_58 = (~((a->ne[0] + -1) * (long)dilation0) + (long)(pad0 * 2) + b->ne[0]) /
                 (long)stride0 + 1;
      local_50 = (~((a->ne[1] + -1) * (long)dilation1) + (long)(pad1 * 2) + b->ne[1]) /
                 (long)stride1 + 1;
      local_40 = b->ne[3];
      local_48 = b->ne[2];
      pgVar2 = ggml_new_tensor_impl(ctx,b->type,4,&local_58,(ggml_tensor *)0x0,0);
      if (((b->nb[2] < b->nb[0]) && (b->nb[0] < b->nb[1])) &&
         (b->nb[2] == type_traits[b->type].type_size)) {
        if ((0x5f000003UL >> ((ulong)pgVar2->type & 0x3f) & 1) == 0) {
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
          pcVar3 = "ggml_blck_size(result->type) == 1";
          line = 0xff7;
          goto LAB_0011da3b;
        }
        sVar1 = type_traits[pgVar2->type].type_size;
        sVar4 = pgVar2->ne[2] * sVar1;
        pgVar2->nb[0] = sVar4;
        pgVar2->nb[1] = sVar4 * pgVar2->ne[0];
        pgVar2->nb[2] = sVar1;
      }
      if (pgVar2 != (ggml_tensor *)0x0) {
        pgVar2->op_params[0] = stride0;
        pgVar2->op_params[1] = stride1;
        pgVar2->op_params[2] = pad0;
        pgVar2->op_params[3] = pad1;
        pgVar2->op_params[4] = dilation0;
        pgVar2->op_params[5] = dilation1;
        pgVar2->op = GGML_OP_CONV_2D_DW;
        pgVar2->src[0] = a;
        pgVar2->src[1] = b;
        return pgVar2;
      }
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-impl.h";
      pcVar3 = "tensor != NULL";
      line = 0x70;
    }
    else {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
      pcVar3 = "a->ne[3] == b->ne[2]";
      line = 0xfeb;
    }
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
    pcVar3 = "a->ne[2] == 1";
    line = 0xfea;
  }
LAB_0011da3b:
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

struct ggml_tensor * ggml_conv_2d_dw_direct(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   stride0,
        int                   stride1,
        int                   pad0,
        int                   pad1,
        int                   dilation0,
        int                   dilation1) {
    GGML_ASSERT(a->ne[2] == 1);
    GGML_ASSERT(a->ne[3] == b->ne[2]);
    int64_t ne[4];
    ne[0] = ggml_calc_conv_output_size(b->ne[0], a->ne[0], stride0, pad0, dilation0);
    ne[1] = ggml_calc_conv_output_size(b->ne[1], a->ne[1], stride1, pad1, dilation1);
    ne[2] = b->ne[2];
    ne[3] = b->ne[3];

    struct ggml_tensor * result = ggml_new_tensor(ctx, b->type, 4, ne);

    if (ggml_is_contiguous_channels(b)) {
        // Result will be permuted the same way as input (CWHN order)
        const int64_t type_size = ggml_type_size(result->type);
        GGML_ASSERT(ggml_blck_size(result->type) == 1);
        result->nb[0] = result->ne[2] * type_size;
        result->nb[1] = result->ne[0] * result->nb[0];
        result->nb[2] = type_size;
    }

    int32_t params[] = { stride0, stride1, pad0, pad1, dilation0, dilation1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_CONV_2D_DW;
    result->src[0] = a;
    result->src[1] = b;
    return result;
}